

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control.h
# Opt level: O0

string * ipx::Textline<char[48]>(char (*text) [48])

{
  char *in_RSI;
  string *in_RDI;
  ostringstream s;
  fmtflags in_stack_fffffffffffffe4c;
  string *this;
  ostream local_188;
  char *local_10;
  
  this = in_RDI;
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_188);
  std::operator<<(&local_188,"    ");
  std::ios_base::setf((ios_base *)this,in_stack_fffffffffffffe4c);
  std::ios_base::width
            ((ios_base *)(local_188._vptr_basic_ostream[-3] + (long)&local_188._vptr_basic_ostream),
             0x34);
  std::operator<<(&local_188,local_10);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_188);
  return in_RDI;
}

Assistant:

std::string Textline(const T& text) {
    std::ostringstream s;
    s << "    ";
    s.setf(std::ios_base::left);
    s.width(52);
    s << text;
    return s.str();
}